

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long in_RCX;
  uint *puVar10;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  long in_R8;
  long in_R9;
  float MjPj;
  int j;
  float sum2B;
  float sum2A;
  float *matrices2Ptr;
  float *matrices1Ptr;
  int i;
  int k;
  float *destPtr;
  float *partials2Ptr;
  float *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  float *tmpdestPtr;
  int stateCountModFour;
  int matrixIncr;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_88;
  float local_84;
  int local_70;
  float local_6c;
  uint *local_68;
  long local_60;
  long local_58;
  int local_48;
  uint *local_40;
  
  fVar1 = in_RDI[9];
  iVar9 = (int)in_RDI[9] / 4 << 2;
  std::fill<float*,int>
            ((float *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_RDI,
             (int *)0x1a63e6);
  for (local_48 = 0; local_48 < (int)in_RDI[0xd]; local_48 = local_48 + 1) {
    iVar6 = local_48 * (int)in_RDI[0xb] * (int)in_RDI[5] + (int)in_RDI[0xb] * (int)MjPj;
    fVar2 = in_RDI[0x10];
    local_58 = in_RDX + (long)iVar6 * 4;
    local_60 = in_R8 + (long)iVar6 * 4;
    local_68 = (uint *)(in_RSI + (long)iVar6 * 4);
    for (local_6c = MjPj; (int)local_6c < (int)sum2B; local_6c = (float)((int)local_6c + 1)) {
      for (local_70 = 0; local_70 < (int)in_RDI[9]; local_70 = local_70 + 1) {
        lVar7 = in_RCX + (long)(local_48 * (int)fVar2) * 4 + (long)(local_70 * ((int)fVar1 + 1)) * 4
        ;
        lVar8 = in_R9 + (long)(local_48 * (int)fVar2) * 4 + (long)(local_70 * ((int)fVar1 + 1)) * 4;
        local_84 = 0.0;
        local_88 = 0.0;
        for (iVar6 = 0; iVar6 < iVar9; iVar6 = iVar6 + 4) {
          auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_60 + (long)iVar6 * 4)),
                                   ZEXT416(*(uint *)(lVar8 + (long)iVar6 * 4)),
                                   ZEXT416((uint)local_84));
          auVar5 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_60 + (long)(iVar6 + 1) * 4)),
                                   ZEXT416(*(uint *)(lVar8 + (long)(iVar6 + 1) * 4)),
                                   ZEXT416((uint)local_88));
          auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_60 + (long)(iVar6 + 2) * 4)),
                                   ZEXT416(*(uint *)(lVar8 + (long)(iVar6 + 2) * 4)),
                                   ZEXT416(auVar4._0_4_));
          local_84 = auVar4._0_4_;
          auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_60 + (long)(iVar6 + 3) * 4)),
                                   ZEXT416(*(uint *)(lVar8 + (long)(iVar6 + 3) * 4)),
                                   ZEXT416(auVar5._0_4_));
          local_88 = auVar4._0_4_;
        }
        for (; iVar6 < (int)in_RDI[9]; iVar6 = iVar6 + 1) {
          auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_60 + (long)iVar6 * 4)),
                                   ZEXT416(*(uint *)(lVar8 + (long)iVar6 * 4)),
                                   ZEXT416((uint)local_84));
          local_84 = auVar4._0_4_;
        }
        local_40 = local_68;
        fVar3 = (local_84 + local_88) * *(float *)(local_58 + (long)local_70 * 4);
        for (iVar6 = 0; iVar6 < iVar9; iVar6 = iVar6 + 4) {
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416(*(uint *)(lVar7 + (long)iVar6 * 4)),
                                   ZEXT416(*local_40));
          *local_40 = auVar4._0_4_;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar3),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar6 + 1) * 4)),
                                   ZEXT416(local_40[1]));
          local_40[1] = auVar4._0_4_;
          puVar10 = local_40 + 3;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar3),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar6 + 2) * 4)),
                                   ZEXT416(local_40[2]));
          local_40[2] = auVar4._0_4_;
          local_40 = local_40 + 4;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar3),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar6 + 3) * 4)),
                                   ZEXT416(*puVar10));
          *puVar10 = auVar4._0_4_;
        }
        for (; iVar6 < (int)in_RDI[9]; iVar6 = iVar6 + 1) {
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416(*(uint *)(lVar7 + (long)iVar6 * 4)),
                                   ZEXT416(*local_40));
          *local_40 = auVar4._0_4_;
          local_40 = local_40 + 1;
        }
      }
      local_68 = local_68 + (int)in_RDI[0xb];
      local_58 = local_58 + (long)(int)in_RDI[0xb] * 4;
      local_60 = local_60 + (long)(int)in_RDI[0xb] * 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}